

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O2

void form_global_comm(comm_data *param_1,comm_data *global_data,
                     vector<int,_std::allocator<int>_> *param_3,MPI_Comm mpi_comm,
                     topo_data *topo_info,int tag)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  ulong uVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  size_type __new_size;
  value_type_conflict local_9c;
  vector<int,_std::allocator<int>_> node_sizes;
  vector<int,_std::allocator<int>_> node_ctr;
  int local_num_procs;
  int local_rank;
  int num_procs;
  int rank;
  vector<int,_std::allocator<int>_> tmp_send_indices;
  
  tmp_send_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tmp_send_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tmp_send_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  node_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  node_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  node_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  node_ctr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  node_ctr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  node_ctr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
  MPI_Comm_size(&ompi_mpi_comm_world,&num_procs);
  MPI_Comm_rank(*(undefined8 *)(mpi_comm + 0x10),&local_rank);
  MPI_Comm_size(*(undefined8 *)(mpi_comm + 0x10),&local_num_procs);
  uVar1 = *(uint *)(mpi_comm + 8);
  local_9c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&node_sizes,(long)(int)uVar1,&local_9c);
  piVar5 = (param_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar10 = 0; lVar10 < param_1->num_msgs; lVar10 = lVar10 + 1) {
    iVar2 = piVar5[lVar10];
    iVar3 = param_1->indptr[lVar10 + 1];
    iVar4 = param_1->indptr[lVar10];
    iVar13 = node_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar2];
    if (iVar13 == 0) {
      global_data->num_msgs = global_data->num_msgs + 1;
      iVar13 = node_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar2];
    }
    node_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar2] = (iVar3 - iVar4) + iVar13;
  }
  iVar2 = global_data->num_msgs;
  __new_size = (size_type)iVar2;
  uVar6 = 0xffffffffffffffff;
  if (__new_size != 0) {
    uVar11 = __new_size * 4;
    if (iVar2 < 0) {
      uVar11 = uVar6;
    }
    piVar7 = (int *)operator_new__(uVar11);
    global_data->procs = piVar7;
  }
  uVar11 = __new_size * 4 + 4;
  if (iVar2 < -1) {
    uVar11 = uVar6;
  }
  piVar7 = (int *)operator_new__(uVar11);
  global_data->indptr = piVar7;
  local_9c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&node_ctr,__new_size,&local_9c);
  global_data->num_msgs = 0;
  piVar7 = global_data->indptr;
  *piVar7 = 0;
  uVar9 = 0;
  uVar11 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar11 = uVar9;
  }
  for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    if (node_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] != 0) {
      global_data->procs[global_data->num_msgs] = (int)uVar9;
      global_data->size_msgs =
           global_data->size_msgs +
           node_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar9];
      iVar2 = global_data->num_msgs;
      node_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] = iVar2;
      global_data->num_msgs = iVar2 + 1;
      piVar7[(long)iVar2 + 1] = global_data->size_msgs;
    }
  }
  iVar2 = global_data->size_msgs;
  if ((long)iVar2 != 0) {
    uVar11 = (long)iVar2 << 2;
    if (iVar2 < 0) {
      uVar11 = uVar6;
    }
    piVar8 = (int *)operator_new__(uVar11);
    global_data->indices = piVar8;
  }
  piVar5 = (param_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar10 = 0;
  while (lVar10 < param_1->num_msgs) {
    iVar2 = node_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[piVar5[lVar10]];
    piVar8 = param_1->indptr + lVar10;
    iVar3 = param_1->indptr[lVar10 + 1];
    lVar10 = lVar10 + 1;
    for (lVar12 = (long)*piVar8; lVar12 < iVar3; lVar12 = lVar12 + 1) {
      iVar4 = piVar7[iVar2];
      iVar13 = node_ctr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar2];
      node_ctr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar2] = iVar13 + 1;
      global_data->indices[(long)iVar4 + (long)iVar13] = param_1->indices[lVar12];
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&node_ctr.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&node_sizes.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&tmp_send_indices.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

static void form_global_comm(comm_data* local_data, comm_data* global_data,
        std::vector<int>& local_data_nodes, MPI_Comm mpi_comm,
        topo_data* topo_info, int tag)
{
    std::vector<int> tmp_send_indices;
    std::vector<int> node_sizes;
    std::vector<int> node_ctr;

    // Get MPI Information
    int rank, num_procs;
    int local_rank, local_num_procs;
    MPI_Comm_rank(mpi_comm, &rank);
    MPI_Comm_size(mpi_comm, &num_procs);
    MPI_Comm& local_comm = topo_info->local_comm;
    MPI_Comm_rank(local_comm, &local_rank);
    MPI_Comm_size(local_comm, &local_num_procs);
    int num_nodes = topo_info->num_nodes;
    int rank_node = topo_info->rank_node;

    int node_idx;
    int start, end, idx;
    int ctr, node, size;

    node_sizes.resize(num_nodes, 0);

    for (int i = 0; i < local_data->num_msgs; i++)
    {
        node = local_data_nodes[i];
        size = local_data->indptr[i+1] - local_data->indptr[i];
        if (node_sizes[node] == 0)
        {
            global_data->num_msgs++;
        }
        node_sizes[node] += size;
    }
    if (global_data->num_msgs)
        global_data->procs = new int[global_data->num_msgs];
    global_data->indptr = new int[global_data->num_msgs+1];
    node_ctr.resize(global_data->num_msgs, 0);

    global_data->num_msgs = 0;
    global_data->indptr[0] = 0;
    for (int i = 0; i < num_nodes; i++)
    {
        if (node_sizes[i])
        {
            global_data->procs[global_data->num_msgs] = i;
            global_data->size_msgs += node_sizes[i];
            node_sizes[i] = global_data->num_msgs;
            global_data->num_msgs++;
            global_data->indptr[global_data->num_msgs] = global_data->size_msgs;
        }
    }

    if (global_data->size_msgs)
        global_data->indices = new int[global_data->size_msgs];
    for (int i = 0; i < local_data->num_msgs; i++)
    {
        node = local_data_nodes[i];
        node_idx = node_sizes[node];
        start = local_data->indptr[i];
        end = local_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            idx = global_data->indptr[node_idx] + node_ctr[node_idx]++;
            global_data->indices[idx] = local_data->indices[j];
        }
    }
}